

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_TestShell
::
TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_TestShell
          (TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_TestShell
           *this)

{
  TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_TestShell
  *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &
       PTR__TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_TestShell_00332618
  ;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionComparatorThatFailsCoversValueToString)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(5);
    MockFunctionComparator comparator(myTypeIsEqual, myTypeValueToString);
    mock().installComparator("MyTypeForTesting", comparator);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("function")->withParameterOfType("MyTypeForTesting", "parameterName", &object);
    MockExpectedCallsDidntHappenFailure failure(UtestShell::getCurrent(), expectations);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE_LOCATION(failure, __FILE__, __LINE__);
}